

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O3

UBool __thiscall icu_63::UVector32::operator==(UVector32 *this,UVector32 *other)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = this->count;
  if (uVar1 != other->count) {
    return '\0';
  }
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      if (this->elements[uVar2] != other->elements[uVar2]) {
        return '\0';
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return '\x01';
}

Assistant:

UBool UVector32::operator==(const UVector32& other) {
    int32_t i;
    if (count != other.count) return FALSE;
    for (i=0; i<count; ++i) {
        if (elements[i] != other.elements[i]) {
            return FALSE;
        }
    }
    return TRUE;
}